

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O2

void __thiscall Encode::Encode(Encode *this,List *list)

{
  vector<char,_std::allocator<char>_> *this_00;
  Node **ppNVar1;
  ulong uVar2;
  ulong uVar3;
  Node *pNVar4;
  long lVar5;
  size_type sVar6;
  char *j;
  _Alloc_hider _Var7;
  string tmpStr;
  string local_50;
  
  this_00 = &this->m_data;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_matrix).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_matrix).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_matrix).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ppNVar1 = list->m_indexArray;
  uVar3 = 0;
  uVar2 = (ulong)(uint)list->m_listSize;
  if (list->m_listSize < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    tmpStr._M_dataplus._M_p = (pointer)&tmpStr.field_2;
    tmpStr._M_string_length = 0;
    tmpStr.field_2._M_local_buf[0] = '\0';
    for (lVar5 = 8; pNVar4 = ppNVar1[uVar3], *(char *)((long)&pNVar4->next + lVar5) != '\0';
        lVar5 = lVar5 + 1) {
      std::vector<char,_std::allocator<char>_>::push_back
                (this_00,(value_type *)((long)&pNVar4->next + lVar5));
    }
    lVar5 = 0x14;
    while (*(char *)((long)&pNVar4->next + lVar5) != '\0') {
      std::vector<char,_std::allocator<char>_>::push_back
                (this_00,(value_type *)((long)&pNVar4->next + lVar5));
      lVar5 = lVar5 + 1;
      pNVar4 = ppNVar1[uVar3];
    }
    lVar5 = 0x34;
    while (*(char *)((long)&pNVar4->next + lVar5) != '\0') {
      std::vector<char,_std::allocator<char>_>::push_back
                (this_00,(value_type *)((long)&pNVar4->next + lVar5));
      lVar5 = lVar5 + 1;
      pNVar4 = ppNVar1[uVar3];
    }
    std::__cxx11::to_string(&local_50,(int)(pNVar4->field_1).data.year);
    std::__cxx11::string::operator=((string *)&tmpStr,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    _Var7 = tmpStr._M_dataplus;
    for (sVar6 = tmpStr._M_string_length; sVar6 != 0; sVar6 = sVar6 - 1) {
      std::vector<char,_std::allocator<char>_>::push_back(this_00,_Var7._M_p);
      _Var7._M_p = _Var7._M_p + 1;
    }
    std::__cxx11::to_string(&local_50,(int)(ppNVar1[uVar3]->field_1).data.qtyPages);
    std::__cxx11::string::operator=((string *)&tmpStr,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    _Var7 = tmpStr._M_dataplus;
    for (sVar6 = tmpStr._M_string_length; sVar6 != 0; sVar6 = sVar6 - 1) {
      std::vector<char,_std::allocator<char>_>::push_back(this_00,_Var7._M_p);
      _Var7._M_p = _Var7._M_p + 1;
    }
    std::__cxx11::string::~string((string *)&tmpStr);
  }
  return;
}

Assistant:

explicit Encode(List &list) {
        Node **listIndexArr = list.getIndexArray();
        int listSize = list.getIndexArraySize();
        for (int i = 0; i < listSize; ++i) {
            string tmpStr;
            for (int j = 0; listIndexArr[i]->data.author[j] != '\0'; j++) {
                m_data.push_back(listIndexArr[i]->data.author[j]);
            }
            for (int j = 0; listIndexArr[i]->data.title[j] != '\0'; j++) {
                m_data.push_back(listIndexArr[i]->data.title[j]);
            }
            for (int j = 0; listIndexArr[i]->data.publishingHouse[j] != '\0'; j++) {
                m_data.push_back(listIndexArr[i]->data.publishingHouse[j]);
            }
            tmpStr = to_string(listIndexArr[i]->data.year);
            for (auto &j : tmpStr) {
                m_data.push_back(j);
            }
            tmpStr = to_string(listIndexArr[i]->data.qtyPages);
            for (auto &j : tmpStr) {
                m_data.push_back(j);
            }
        }
    }